

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O3

bool __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantPrimitiveSetTestInstance::
compare(InvariantPrimitiveSetTestInstance *this,PerPrimitiveVec *primitivesA,
       PerPrimitiveVec *primitivesB,int param_3)

{
  ostringstream *this_00;
  pointer this_01;
  bool bVar1;
  undefined1 local_190 [384];
  
  this_01 = (primitivesA->
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar1 = comparePrimitivesExact
                    ((PrimitiveSetInvariance *)this_01,
                     (primitivesB->
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (PerPrimitive *)
                     ((ulong)((long)(primitivesA->
                                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)this_01) >>
                     6),param_3);
  if (!bVar1) {
    local_190._0_8_ =
         ((this->super_InvarianceTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Failure: tessellation coordinates differ between two programs",
               0x3d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  }
  return bVar1;
}

Assistant:

bool compare (const PerPrimitiveVec& primitivesA, const PerPrimitiveVec& primitivesB, const int) const
	{
		if (!comparePrimitivesExact(&primitivesA[0], &primitivesB[0], static_cast<int>(primitivesA.size())))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Failure: tessellation coordinates differ between two programs" << tcu::TestLog::EndMessage;

			return false;
		}
		return true;
	}